

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdesinfo.cpp
# Opt level: O3

int __thiscall
jrtplib::RTCPSDESInfo::DeletePrivatePrefix(RTCPSDESInfo *this,uint8_t *prefix,size_t prefixlen)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  RTPMemoryManager *pRVar4;
  int iVar5;
  
  p_Var2 = (this->privitems).
           super__List_base<jrtplib::RTCPSDESInfo::SDESPrivateItem_*,_std::allocator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while( true ) {
    if (p_Var2 == (_List_node_base *)&this->privitems) {
      return -0x39;
    }
    if ((*(_List_node_base **)((long)(p_Var2[1]._M_next + 2) + 8) == (_List_node_base *)prefixlen)
       && ((prefixlen == 0 ||
           (iVar5 = bcmp(prefix,p_Var2[1]._M_next[2]._M_next,prefixlen), iVar5 == 0)))) break;
    p_Var2 = p_Var2->_M_next;
  }
  p_Var3 = p_Var2[1]._M_next;
  pRVar4 = (this->super_RTPMemoryObject).mgr;
  if (pRVar4 == (RTPMemoryManager *)0x0) {
    if (p_Var3 != (_List_node_base *)0x0) {
      (**(code **)((long)p_Var3->_M_next + 8))(p_Var3);
    }
  }
  else {
    (**(code **)p_Var3->_M_next)(p_Var3);
    (**(code **)(*(long *)pRVar4 + 0x18))(pRVar4,p_Var3);
  }
  psVar1 = &(this->privitems).
            super__List_base<jrtplib::RTCPSDESInfo::SDESPrivateItem_*,_std::allocator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 - 1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(p_Var2,0x18);
  return 0;
}

Assistant:

int RTCPSDESInfo::DeletePrivatePrefix(const uint8_t *prefix,size_t prefixlen)
{
	std::list<SDESPrivateItem *>::iterator it;
	bool found;
	
	found = false;
	it = privitems.begin();
	while (!found && it != privitems.end())
	{
		uint8_t *p;
		size_t l;
		
		p = (*it)->GetPrefix(&l);
		if (l == prefixlen)
		{
			if (l <= 0)
				found = true;
			else if (memcmp(prefix,p,l) == 0)
				found = true;
			else
				++it;
		}
		else
			++it;
	}
	if (!found)
		return ERR_RTP_SDES_PREFIXNOTFOUND;
	
	RTPDelete(*it,GetMemoryManager());
	privitems.erase(it);
	return 0;
}